

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkDeviceSize __thiscall VmaAllocation_T::GetOffset(VmaAllocation_T *this)

{
  undefined8 *in_RDI;
  VkDeviceSize local_8;
  
  if (*(char *)((long)in_RDI + 0x4c) == '\x01') {
    local_8 = (**(code **)(**(long **)*in_RDI + 0x48))(*(long **)*in_RDI,in_RDI[1]);
  }
  else if (*(char *)((long)in_RDI + 0x4c) == '\x02') {
    local_8 = 0;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

VkDeviceSize VmaAllocation_T::GetOffset() const
{
    switch (m_Type)
    {
    case ALLOCATION_TYPE_BLOCK:
        return m_BlockAllocation.m_Block->m_pMetadata->GetAllocationOffset(m_BlockAllocation.m_AllocHandle);
    case ALLOCATION_TYPE_DEDICATED:
        return 0;
    default:
        VMA_ASSERT(0);
        return 0;
    }
}